

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bonk~.c
# Opt level: O2

void bonk_dsp(t_bonk *x,t_signal **sp)

{
  int iVar1;
  int iVar2;
  long lVar3;
  t_sample **pptVar4;
  
  iVar1 = (*sp)->s_n;
  lVar3 = 0;
  iVar2 = x->x_ninsig;
  if (x->x_ninsig < 1) {
    iVar2 = 0;
  }
  x->x_sr = (*sp)->s_sr;
  pptVar4 = &x->x_insig->g_invec;
  for (; iVar2 != (int)lVar3; lVar3 = lVar3 + 1) {
    *pptVar4 = sp[lVar3]->s_vec;
    pptVar4 = pptVar4 + 0x4b3;
  }
  dsp_add(bonk_perform,2,x,(long)iVar1);
  return;
}

Assistant:

static void bonk_dsp(t_bonk *x, t_signal **sp)
{
    int i, n = sp[0]->s_n, ninsig = x->x_ninsig;
    t_insig *gp;
    
    x->x_sr = sp[0]->s_sr;
    
    for (i = 0, gp = x->x_insig; i < ninsig; i++, gp++)
        gp->g_invec = (*(sp++))->s_vec;
    
    dsp_add(bonk_perform, 2, x, (t_int)n);
}